

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLExportTest.cpp
# Opt level: O2

void __thiscall
ODDLParser::OpenDDLExportTest_writeStringTest_Test::TestBody
          (OpenDDLExportTest_writeStringTest_Test *this)

{
  Value *this_00;
  char *message;
  char *in_R9;
  AssertHelper local_90;
  char tempString [5];
  AssertHelper local_80;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  string statement;
  Value *v;
  OpenDDLExportMock myExport;
  
  OpenDDLExportMock::OpenDDLExportMock(&myExport);
  builtin_strncpy(tempString,"huhu",5);
  this_00 = ValueAllocator::allocPrimData(ddl_string,5);
  v = this_00;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&statement,tempString,(allocator<char> *)&gtest_ar);
  Value::setString(this_00,&statement);
  std::__cxx11::string::~string((string *)&statement);
  statement._M_dataplus._M_p = (pointer)&statement.field_2;
  statement._M_string_length = 0;
  statement.field_2._M_local_buf[0] = '\0';
  gtest_ar_.success_ = OpenDDLExport::writeValue(&myExport.super_OpenDDLExport,this_00,&statement);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (!gtest_ar_.success_) {
    testing::Message::Message((Message *)&local_90);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&gtest_ar_,(AssertionResult *)"ok","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLExportTest.cpp"
               ,0xe8,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    std::__cxx11::string::~string((string *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_90);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  testing::internal::CmpHelperEQ<char[7],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"\\\"huhu\\\"\"","statement",(char (*) [7])"\"huhu\"",
             &statement);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/kimkulling[P]openddl-parser/test/OpenDDLExportTest.cpp"
               ,0xe9,message);
    testing::internal::AssertHelper::operator=(&local_90,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  ValueAllocator::releasePrimData(&v);
  std::__cxx11::string::~string((string *)&statement);
  OpenDDLExport::~OpenDDLExport(&myExport.super_OpenDDLExport);
  return;
}

Assistant:

TEST_F(OpenDDLExportTest, writeStringTest) {
    OpenDDLExportMock myExport;
    char tempString[] = "huhu";
    Value *v = ValueAllocator::allocPrimData(Value::ValueType::ddl_string, sizeof(tempString));
    v->setString(tempString);
    bool ok(true);
    std::string statement;
    ok = myExport.writeValueTester(v, statement);
    EXPECT_TRUE(ok);
    EXPECT_EQ("\"huhu\"", statement);
    ValueAllocator::releasePrimData(&v);
}